

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O0

uint128 * __thiscall trng::portable_impl::uint128::operator>>=(uint128 *this,int s)

{
  uint128 *in_RDI;
  uint128 uVar1;
  uint128 result;
  uint64_t in_stack_ffffffffffffffe0;
  uint64_t local_18;
  
  uVar1.m_hi = in_stack_ffffffffffffffe0;
  uVar1.m_lo = in_RDI->m_hi;
  uVar1 = portable_impl::operator>>(uVar1,(int)(in_RDI->m_lo >> 0x20));
  local_18 = uVar1.m_hi;
  in_RDI->m_lo = uVar1.m_lo;
  in_RDI->m_hi = local_18;
  return in_RDI;
}

Assistant:

uint128 &operator>>=(int s) {
        const uint128 result(*this >> s);
        *this = result;
        return *this;
      }